

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsfft.c
# Opt level: O0

void bluestein_exp(fft_data *hl,fft_data *hlt,int len,int M)

{
  int iVar1;
  double dVar2;
  double dVar3;
  int local_44;
  int i;
  int len2;
  int l2;
  double angle;
  double theta;
  double PI;
  int M_local;
  int len_local;
  fft_data *hlt_local;
  fft_data *hl_local;
  
  i = 0;
  for (local_44 = 0; iVar1 = len, local_44 < len; local_44 = local_44 + 1) {
    dVar2 = (3.141592653589793 / (double)len) * (double)i;
    dVar3 = cos(dVar2);
    hlt[local_44].re = dVar3;
    dVar2 = sin(dVar2);
    hlt[local_44].im = dVar2;
    hl[local_44].re = hlt[local_44].re;
    hl[local_44].im = hlt[local_44].im;
    for (i = local_44 * 2 + 1 + i; len * 2 < i; i = i + len * -2) {
    }
  }
  while (local_44 = iVar1, local_44 < (M - len) + 1) {
    hl[local_44].re = 0.0;
    hl[local_44].im = 0.0;
    iVar1 = local_44 + 1;
  }
  local_44 = M - len;
  while (local_44 = local_44 + 1, local_44 < M) {
    hl[local_44].re = hlt[M - local_44].re;
    hl[local_44].im = hlt[M - local_44].im;
  }
  return;
}

Assistant:

static void bluestein_exp(fft_data *hl, fft_data *hlt, int len, int M) {
	fft_type PI,theta,angle;
	int l2,len2,i;
	PI = 3.1415926535897932384626433832795;
	theta = PI / len;
	l2 = 0;
	len2 = 2 * len;

	for (i = 0 ; i < len; ++i) {
		angle = theta * l2;
		hlt[i].re = cos(angle);
		hlt[i].im = sin(angle);
		hl[i].re = hlt[i].re;
		hl[i].im = hlt[i].im;
		l2+=2*i+1;
		while (l2 > len2) {
			l2-=len2;
		}

	}

	for (i = len; i < M-len+1; i++) {
		hl[i].re = 0.0;
		hl[i].im = 0.0;
	}

	for (i = M - len + 1; i < M; i++) {
		hl[i].re = hlt[M-i].re;
		hl[i].im = hlt[M-i].im;
	}

}